

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::RemoveInventory(AActor *this,AInventory *item)

{
  AInventory *pAVar1;
  AInventory *pAVar2;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar3;
  
  if (item == (AInventory *)0x0) {
    return;
  }
  pAVar2 = (AInventory *)(item->Owner).field_0.p;
  if (pAVar2 == (AInventory *)0x0) {
    return;
  }
  if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
    paVar3 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *)&item->Owner;
    goto LAB_0041f6f2;
  }
  do {
    pAVar1 = pAVar2;
    pAVar2 = (pAVar1->super_AActor).Inventory.field_0.p;
    if (pAVar2 == (AInventory *)0x0) {
      return;
    }
  } while (pAVar2 != item);
  paVar3 = &(item->super_AActor).Inventory.field_0;
  pAVar2 = (item->super_AActor).Inventory.field_0.p;
  if (pAVar2 == (AInventory *)0x0) {
LAB_0041f6c6:
    pAVar2 = (AInventory *)0x0;
  }
  else if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
    (((TObjPtr<AInventory> *)paVar3)->field_0).p = (AInventory *)0x0;
    goto LAB_0041f6c6;
  }
  (pAVar1->super_AActor).Inventory.field_0.p = pAVar2;
  (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2a])(item);
  (item->Owner).field_0.p = (AActor *)0x0;
LAB_0041f6f2:
  paVar3->p = (AInventory *)0x0;
  return;
}

Assistant:

void AActor::RemoveInventory(AInventory *item)
{
	AInventory *inv, **invp;

	if (item != NULL && item->Owner != NULL)	// can happen if the owner was destroyed by some action from an item's use state.
	{
		invp = &item->Owner->Inventory;
		for (inv = *invp; inv != NULL; invp = &inv->Inventory, inv = *invp)
		{
			if (inv == item)
			{
				*invp = item->Inventory;
				item->DetachFromOwner();
				item->Owner = NULL;
				item->Inventory = NULL;
				break;
			}
		}
	}
}